

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O3

Sexp * GcHeap::AllocateString(jet_string str)

{
  Sexp *pSVar1;
  char *pcVar2;
  
  if (g_heap == (GcHeap *)0x0) {
    __assert_fail("g_heap != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h"
                  ,0xe0,"static Sexp *GcHeap::AllocateString(jet_string)");
  }
  pSVar1 = Allocate(g_heap,true);
  if (pSVar1 != (Sexp *)0x0) {
    pSVar1->kind = STRING;
    pcVar2 = strdup(str);
    (pSVar1->field_1).string_value = pcVar2;
    return pSVar1;
  }
  __assert_fail("s != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h",
                0xe2,"static Sexp *GcHeap::AllocateString(jet_string)");
}

Assistant:

static Sexp *AllocateString(jet_string str) {
    assert(g_heap != nullptr);
    Sexp *s = g_heap->Allocate(true);
    assert(s != nullptr);
    s->kind = Sexp::Kind::STRING;
    s->string_value = strdup(str);
    return s;
  }